

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

wchar_t slot_by_name(player *p,char *name)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (p->body).count;
  lVar3 = 0x10;
  uVar4 = 0;
  while( true ) {
    if (uVar1 == uVar4) {
      __assert_fail("i < p->body.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x3f,"int slot_by_name(struct player *, const char *)");
    }
    iVar2 = strcmp(name,*(char **)((long)&((p->body).slots)->next + lVar3));
    if (iVar2 == 0) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  }
  return (wchar_t)uVar4;
}

Assistant:

int slot_by_name(struct player *p, const char *name)
{
	int i;

	/* Look for the correctly named slot */
	for (i = 0; i < p->body.count; i++) {
		if (streq(name, p->body.slots[i].name)) {
			break;
		}
	}

	assert(i < p->body.count);

	/* Index for that slot */
	return i;
}